

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O1

void rgb24_yuv420_std(uint32_t width,uint32_t height,uint8_t *RGB,uint32_t RGB_stride,uint8_t *Y,
                     uint8_t *U,uint8_t *V,uint32_t Y_stride,uint32_t UV_stride,YCbCrType yuv_type)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint8_t *puVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  uint local_b8;
  ulong local_b0;
  
  if (height != 1) {
    uVar14 = (ulong)yuv_type;
    iVar12 = RGB_stride * 2;
    iVar13 = Y_stride * 2;
    local_b0 = 0;
    uVar24 = 0;
    local_b8 = 0;
    do {
      if (width != 1) {
        uVar21 = (ulong)((local_b8 >> 1) * UV_stride);
        uVar16 = (uint)RGB2YUV[uVar14].r_factor;
        uVar17 = (uint)RGB2YUV[uVar14].g_factor;
        uVar18 = (uint)RGB2YUV[uVar14].b_factor;
        uVar19 = (uint)RGB2YUV[uVar14].y_factor;
        uVar1 = RGB2YUV[uVar14].y_offset;
        bVar2 = RGB2YUV[uVar14].cb_factor;
        bVar3 = RGB2YUV[uVar14].cr_factor;
        lVar27 = 0;
        puVar15 = RGB;
        do {
          bVar4 = puVar15[uVar24];
          bVar5 = puVar15[(ulong)uVar24 + 2];
          uVar23 = bVar5 * uVar18 + puVar15[(ulong)uVar24 + 1] * uVar17 + bVar4 * uVar16 >> 8 & 0xff
          ;
          Y[lVar27 + local_b0] = (char)(uVar23 * uVar19 >> 7) + uVar1;
          bVar6 = puVar15[(ulong)uVar24 + 3];
          bVar7 = puVar15[(ulong)uVar24 + 5];
          uVar22 = bVar7 * uVar18 + puVar15[(ulong)uVar24 + 4] * uVar17 + bVar6 * uVar16 >> 8 & 0xff
          ;
          Y[lVar27 + local_b0 + 1] = (char)(uVar22 * uVar19 >> 7) + uVar1;
          bVar8 = puVar15[RGB_stride];
          bVar9 = puVar15[(ulong)RGB_stride + 2];
          uVar25 = bVar9 * uVar18 + puVar15[(ulong)RGB_stride + 1] * uVar17 + bVar8 * uVar16 >> 8 &
                   0xff;
          Y[lVar27 + (ulong)Y_stride] = (char)(uVar25 * uVar19 >> 7) + uVar1;
          bVar10 = puVar15[(ulong)RGB_stride + 3];
          bVar11 = puVar15[(ulong)RGB_stride + 5];
          uVar20 = bVar11 * uVar18 + puVar15[(ulong)RGB_stride + 4] * uVar17 + bVar10 * uVar16 >> 8
                   & 0xff;
          iVar26 = uVar25 + uVar22 + uVar20;
          Y[lVar27 + (ulong)Y_stride + 1] = (char)(uVar20 * uVar19 >> 7) + uVar1;
          U[uVar21] = (char)(((((uint)bVar9 + (uint)bVar11 + (uint)bVar5 + (uint)bVar7) - iVar26) -
                              uVar23 >> 2) * (uint)bVar2 >> 8) + 0x80;
          V[uVar21] = (char)((((uint)bVar6 + (uint)bVar8 + (uint)bVar10 + (bVar4 - uVar23)) - iVar26
                             >> 2) * (uint)bVar3 >> 8) + 0x80;
          lVar27 = lVar27 + 2;
          puVar15 = puVar15 + 6;
          uVar21 = uVar21 + 1;
        } while ((uint)lVar27 < width - 1);
      }
      local_b8 = local_b8 + 2;
      uVar24 = uVar24 + iVar12;
      Y_stride = Y_stride + iVar13;
      local_b0 = (ulong)(uint)((int)local_b0 + iVar13);
      RGB_stride = RGB_stride + iVar12;
    } while (local_b8 < height - 1);
  }
  return;
}

Assistant:

void rgb24_yuv420_std(
	uint32_t width, uint32_t height, 
	const uint8_t *RGB, uint32_t RGB_stride, 
	uint8_t *Y, uint8_t *U, uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	YCbCrType yuv_type)
{
	const RGB2YUVParam *const param = &(RGB2YUV[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		for(x=0; x<(width-1); x+=2)
		{
			// compute yuv for the four pixels, u and v values are summed
			uint8_t y_tmp;
			int16_t u_tmp, v_tmp;
			
			y_tmp = (param->r_factor*rgb_ptr1[0] + param->g_factor*rgb_ptr1[1] + param->b_factor*rgb_ptr1[2])>>8;
			u_tmp = rgb_ptr1[2]-y_tmp;
			v_tmp = rgb_ptr1[0]-y_tmp;
			y_ptr1[0]=((y_tmp*param->y_factor)>>7) + param->y_offset;
			
			y_tmp = (param->r_factor*rgb_ptr1[3] + param->g_factor*rgb_ptr1[4] + param->b_factor*rgb_ptr1[5])>>8;
			u_tmp += rgb_ptr1[5]-y_tmp;
			v_tmp += rgb_ptr1[3]-y_tmp;
			y_ptr1[1]=((y_tmp*param->y_factor)>>7) + param->y_offset;

			y_tmp = (param->r_factor*rgb_ptr2[0] + param->g_factor*rgb_ptr2[1] + param->b_factor*rgb_ptr2[2])>>8;
			u_tmp += rgb_ptr2[2]-y_tmp;
			v_tmp += rgb_ptr2[0]-y_tmp;
			y_ptr2[0]=((y_tmp*param->y_factor)>>7) + param->y_offset;
			
			y_tmp = (param->r_factor*rgb_ptr2[3] + param->g_factor*rgb_ptr2[4] + param->b_factor*rgb_ptr2[5])>>8;
			u_tmp += rgb_ptr2[5]-y_tmp;
			v_tmp += rgb_ptr2[3]-y_tmp;
			y_ptr2[1]=((y_tmp*param->y_factor)>>7) + param->y_offset;

			u_ptr[0] = (((u_tmp>>2)*param->cb_factor)>>8) + 128;
			v_ptr[0] = (((v_tmp>>2)*param->cr_factor)>>8) + 128;
			
			rgb_ptr1 += 6;
			rgb_ptr2 += 6;
			y_ptr1 += 2;
			y_ptr2 += 2;
			u_ptr += 1;
			v_ptr += 1;
		}
	}
}